

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

int trytypetag(rnndb *db,char *file,xmlNode *node,rnntypeinfo *ti)

{
  int iVar1;
  rnnvalue *prVar2;
  _xmlNode *p_Var3;
  rnnbitfield *prVar4;
  xmlNode *in_RCX;
  char *in_RDX;
  rnndb *in_RSI;
  char *in_RDI;
  rnnbitfield *bf;
  rnnvalue *val;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = strcmp(*(char **)(in_RDX + 0x10),"value");
  if (iVar1 == 0) {
    prVar2 = parsevalue(in_RSI,in_RDX,in_RCX);
    if (prVar2 != (rnnvalue *)0x0) {
      if (*(int *)((long)&in_RCX->doc + 4) <= *(int *)&in_RCX->doc) {
        if (*(int *)((long)&in_RCX->doc + 4) == 0) {
          *(undefined4 *)((long)&in_RCX->doc + 4) = 0x10;
        }
        else {
          *(int *)((long)&in_RCX->doc + 4) = *(int *)((long)&in_RCX->doc + 4) << 1;
        }
        p_Var3 = (_xmlNode *)realloc(in_RCX->prev,(long)*(int *)((long)&in_RCX->doc + 4) << 3);
        in_RCX->prev = p_Var3;
      }
      iVar1 = *(int *)&in_RCX->doc;
      *(int *)&in_RCX->doc = iVar1 + 1;
      (&in_RCX->prev->_private)[iVar1] = prVar2;
    }
    iVar1 = 1;
  }
  else {
    iVar1 = strcmp(*(char **)(in_RDX + 0x10),"bitfield");
    if (iVar1 == 0) {
      prVar4 = parsebitfield((rnndb *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             in_RDI,(xmlNode *)in_RSI);
      if (prVar4 != (rnnbitfield *)0x0) {
        if (*(int *)((long)&in_RCX->next + 4) <= *(int *)&in_RCX->next) {
          if (*(int *)((long)&in_RCX->next + 4) == 0) {
            *(undefined4 *)((long)&in_RCX->next + 4) = 0x10;
          }
          else {
            *(int *)((long)&in_RCX->next + 4) = *(int *)((long)&in_RCX->next + 4) << 1;
          }
          p_Var3 = (_xmlNode *)realloc(in_RCX->parent,(long)*(int *)((long)&in_RCX->next + 4) << 3);
          in_RCX->parent = p_Var3;
        }
        iVar1 = *(int *)&in_RCX->next;
        *(int *)&in_RCX->next = iVar1 + 1;
        (&in_RCX->parent->_private)[iVar1] = prVar4;
      }
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int trytypetag (struct rnndb *db, char *file, xmlNode *node, struct rnntypeinfo *ti) {
	if (!strcmp(node->name, "value")) {
		struct rnnvalue *val = parsevalue(db, file, node);
		if (val)
			ADDARRAY(ti->vals, val);
		return 1;
	} else if (!strcmp(node->name, "bitfield")) {
		struct rnnbitfield *bf = parsebitfield(db, file, node);
		if (bf)
			ADDARRAY(ti->bitfields, bf);
		return 1;
	}
	return 0;
}